

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::MultiTexShader::setUniforms
          (MultiTexShader *this,Context *ctx,deUint32 program)

{
  undefined4 uVar1;
  uint uVar2;
  undefined8 uVar3;
  const_reference this_00;
  float *pfVar4;
  const_reference pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  Array<float,_16> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string ndxStr;
  int ndx;
  deUint32 program_local;
  Context *ctx_local;
  MultiTexShader *this_local;
  
  ndxStr.field_2._12_4_ = program;
  (*ctx->_vptr_Context[0x76])(ctx,(ulong)program);
  for (ndxStr.field_2._8_4_ = 0;
      (int)ndxStr.field_2._8_4_ < *(int *)&(this->super_ShaderProgram).field_0x154;
      ndxStr.field_2._8_4_ = ndxStr.field_2._8_4_ + 1) {
    de::toString<int>((string *)local_40,(int *)(ndxStr.field_2._M_local_buf + 8));
    uVar1 = ndxStr.field_2._12_4_;
    std::operator+(&local_60,"u_sampler",(string *)local_40);
    uVar3 = std::__cxx11::string::c_str();
    uVar2 = (*ctx->_vptr_Context[0x66])(ctx,(ulong)(uint)uVar1,uVar3);
    (*ctx->_vptr_Context[0x5b])(ctx,(ulong)uVar2,(ulong)(uint)ndxStr.field_2._8_4_);
    std::__cxx11::string::~string((string *)&local_60);
    uVar1 = ndxStr.field_2._12_4_;
    std::operator+(&local_90,"u_trans",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    uVar3 = std::__cxx11::string::c_str();
    uVar2 = (*ctx->_vptr_Context[0x66])(ctx,(ulong)(uint)uVar1,uVar3);
    this_00 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
              operator[](&this->m_transformations,(long)(int)ndxStr.field_2._8_4_);
    tcu::Matrix<float,_4,_4>::getColumnMajorData(&local_d0,this_00);
    pfVar4 = tcu::Array<float,_16>::operator[](&local_d0,0);
    (*ctx->_vptr_Context[0x65])(ctx,(ulong)uVar2,1,0,pfVar4);
    tcu::Array<float,_16>::~Array(&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    uVar1 = ndxStr.field_2._12_4_;
    std::operator+(&local_f0,"u_texScale",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    uVar3 = std::__cxx11::string::c_str();
    uVar2 = (*ctx->_vptr_Context[0x66])(ctx,(ulong)(uint)uVar1,uVar3);
    pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (&this->m_texScales,(long)(int)ndxStr.field_2._8_4_);
    pfVar4 = tcu::Vector<float,_4>::getPtr(pvVar5);
    (*ctx->_vptr_Context[0x5f])(ctx,(ulong)uVar2,1,pfVar4);
    std::__cxx11::string::~string((string *)&local_f0);
    uVar1 = ndxStr.field_2._12_4_;
    std::operator+(&local_110,"u_texBias",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    uVar3 = std::__cxx11::string::c_str();
    uVar2 = (*ctx->_vptr_Context[0x66])(ctx,(ulong)(uint)uVar1,uVar3);
    pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (&this->m_texBiases,(long)(int)ndxStr.field_2._8_4_);
    pfVar4 = tcu::Vector<float,_4>::getPtr(pvVar5);
    (*ctx->_vptr_Context[0x5f])(ctx,(ulong)uVar2,1,pfVar4);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void MultiTexShader::setUniforms (sglr::Context& ctx, deUint32 program) const
{
	ctx.useProgram(program);

	// Sampler and matrix uniforms.

	for (int ndx = 0; ndx < m_numUnits; ndx++)
	{
		string			ndxStr		= de::toString(ndx);

		ctx.uniform1i(ctx.getUniformLocation(program, ("u_sampler" + ndxStr).c_str()), ndx);
		ctx.uniformMatrix4fv(ctx.getUniformLocation(program, ("u_trans" + ndxStr).c_str()), 1, GL_FALSE, (GLfloat*)&m_transformations[ndx].getColumnMajorData()[0]);
		ctx.uniform4fv(ctx.getUniformLocation(program, ("u_texScale" + ndxStr).c_str()), 1, m_texScales[ndx].getPtr());
		ctx.uniform4fv(ctx.getUniformLocation(program, ("u_texBias" + ndxStr).c_str()), 1, m_texBiases[ndx].getPtr());
	}
}